

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules(cmMakefileLibraryTargetGenerator *this)

{
  string *config;
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar1;
  string linkLanguage;
  string extraFlags;
  string linkRuleVar;
  string sStack_98;
  string local_78;
  string local_58;
  string local_38;
  
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  bVar1 = requireDeviceLinking
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,
                     (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     config);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_98,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",(allocator<char> *)&local_58);
    WriteDeviceLibraryRules(this,&sStack_98,false);
    std::__cxx11::string::~string((string *)&sStack_98);
  }
  cmGeneratorTarget::GetLinkerLanguage
            (&sStack_98,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::GetCreateRuleVariable
            (&local_58,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &sStack_98,config);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmsys::SystemTools::UpperCase(&local_38,config);
  cmLocalGenerator::GetStaticLibraryFlags
            ((cmLocalGenerator *)this_00,&local_78,&local_38,&sStack_98,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_38);
  WriteLibraryRules(this,&local_58,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteStaticLibraryRules()
{
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
  if (requiresDeviceLinking) {
    std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
    this->WriteDeviceLibraryRules(linkRuleVar, false);
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);

  std::string linkRuleVar = this->GeneratorTarget->GetCreateRuleVariable(
    linkLanguage, this->ConfigName);

  std::string extraFlags;
  this->LocalGenerator->GetStaticLibraryFlags(
    extraFlags, cmSystemTools::UpperCase(this->ConfigName), linkLanguage,
    this->GeneratorTarget);
  this->WriteLibraryRules(linkRuleVar, extraFlags, false);
}